

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O0

void __thiscall Array<String>::~Array(Array<String> *this)

{
  String *pSVar1;
  String *end;
  String *i;
  Array<String> *this_local;
  
  if ((this->_begin).item != (String *)0x0) {
    pSVar1 = (this->_end).item;
    for (end = (this->_begin).item; end != pSVar1; end = end + 1) {
      String::~String(end);
    }
    pSVar1 = (this->_begin).item;
    if (pSVar1 != (String *)0x0) {
      operator_delete__(pSVar1);
    }
  }
  return;
}

Assistant:

~Array()
  {
    if(_begin.item)
    {
      for(T* i = _begin.item, * end = _end.item; i != end; ++i)
        i->~T();
      delete[] (char*)_begin.item;
    }
  }